

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O3

TA_RetCode TA_GetFuncHandle(char *name,TA_FuncHandle **handle)

{
  char cVar1;
  long lVar2;
  TA_FuncHandle *pTVar3;
  int iVar4;
  TA_RetCode TVar5;
  __int32_t **pp_Var6;
  ulong uVar7;
  ulong uVar8;
  
  TVar5 = TA_BAD_PARAM;
  if (handle != (TA_FuncHandle **)0x0 && name != (char *)0x0) {
    *handle = (TA_FuncHandle *)0x0;
    cVar1 = *name;
    TVar5 = TA_BAD_PARAM;
    if ((long)cVar1 != 0) {
      pp_Var6 = __ctype_tolower_loc();
      if (0xffffffe5 < (int)(char)(*pp_Var6)[cVar1] - 0x7bU) {
        uVar7 = (ulong)(((*pp_Var6)[cVar1] + 0x9fU & 0xff) << 3);
        uVar8 = (ulong)**(uint **)((long)TA_DEF_TablesSize + uVar7);
        if (uVar8 != 0) {
          lVar2 = *(long *)((long)TA_DEF_Tables + uVar7);
          uVar7 = 0;
          do {
            pTVar3 = *(TA_FuncHandle **)(lVar2 + uVar7 * 8);
            if (pTVar3 == (TA_FuncHandle *)0x0) {
              return TA_INTERNAL_ERROR|TA_ALLOC_ERR;
            }
            if (*(undefined8 **)(pTVar3 + 2) == (undefined8 *)0x0) {
              return TA_INTERNAL_ERROR|TA_ALLOC_ERR;
            }
            iVar4 = strcmp((char *)**(undefined8 **)(pTVar3 + 2),name);
            if (iVar4 == 0) {
              *handle = pTVar3;
              return TA_SUCCESS;
            }
            uVar7 = uVar7 + 1;
          } while (uVar8 != uVar7);
        }
      }
      TVar5 = TA_FUNC_NOT_FOUND;
    }
  }
  return TVar5;
}

Assistant:

TA_RetCode TA_GetFuncHandle( const char *name, const TA_FuncHandle **handle )
{
   char firstChar, tmp;
   const TA_FuncDef **funcDefTable;
   const TA_FuncDef *funcDef;
   const TA_FuncInfo *funcInfo;
   unsigned int i, funcDefTableSize;

   /* A TA_FuncHandle is internally a TA_FuncDef. Let's find it
    * by using the alphabetical tables.
    */
   if( (name == NULL) || (handle == NULL) )
   {
      return TA_BAD_PARAM;
   }

   *handle = NULL;

   firstChar = name[0];

   if( firstChar == '\0' )
   {
      return TA_BAD_PARAM;
   }

   tmp = (char)tolower( firstChar );

   if( (tmp < 'a') || (tmp > 'z') )
   {
      return TA_FUNC_NOT_FOUND;
   }

   /* Identify the table. */
   tmp -= (char)'a';
   funcDefTable = TA_DEF_Tables[(int)tmp];

   /* Identify the table size. */
   funcDefTableSize = *TA_DEF_TablesSize[(int)tmp];
   if( funcDefTableSize < 1 )
   {
      return TA_FUNC_NOT_FOUND;
   }

   /* Iterate all entries of the table and return as soon as found. */
   for( i=0; i < funcDefTableSize; i++ )
   {
      funcDef = funcDefTable[i];
      if( !funcDef || !funcDef->funcInfo )
         return TA_INTERNAL_ERROR(3);

      funcInfo = funcDef->funcInfo;
      if( !funcInfo )
         return TA_INTERNAL_ERROR(4);

      if( strcmp( funcInfo->name, name ) == 0 )
      {
         *handle = (TA_FuncHandle *)funcDef;
         return TA_SUCCESS;
      }
   }

   return TA_FUNC_NOT_FOUND;
}